

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

StringPtr capnp::compiler::getExpressionTargetName(Reader exp)

{
  Reader exp_00;
  Which WVar1;
  uint uVar2;
  Reader *this;
  Reader local_178;
  Reader local_148;
  Reader local_108;
  Reader local_d8;
  Reader local_a8;
  Reader local_68;
  undefined1 local_28 [8];
  StringPtr targetName;
  
  this = (Reader *)&stack0x00000008;
  kj::StringPtr::StringPtr((StringPtr *)local_28);
  WVar1 = Expression::Reader::which(this);
  uVar2 = WVar1 - 5;
  if (uVar2 < 6 || WVar1 == 0xb) {
    switch((long)&switchD_008f6e68::switchdataD_00abddf8 +
           (long)(int)(&switchD_008f6e68::switchdataD_00abddf8)[uVar2]) {
    case 0x8f6e6a:
      Expression::Reader::getAbsoluteName(&local_68,this);
      join_0x00000010_0x00000000_ = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_68);
      break;
    case 0x8f6ea0:
      Expression::Reader::getRelativeName(&local_a8,this);
      join_0x00000010_0x00000000_ = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_a8);
      break;
    case 0x8f6edc:
      Expression::Reader::getApplication(&local_108,this);
      Expression::Application::Reader::getFunction(&local_d8,&local_108);
      exp_00._reader.capTable = (CapTableReader *)local_d8._reader.data;
      exp_00._reader.segment = (SegmentReader *)local_d8._reader.capTable;
      exp_00._reader.data = local_d8._reader.pointers;
      exp_00._reader.pointers = (WirePointer *)local_d8._reader._32_8_;
      exp_00._reader.dataSize = local_d8._reader.nestingLimit;
      exp_00._reader.pointerCount = local_d8._reader._44_2_;
      exp_00._reader._38_2_ = local_d8._reader._46_2_;
      exp_00._reader._40_8_ = this;
      join_0x00000010_0x00000000_ = (ArrayPtr<const_char>)getExpressionTargetName(exp_00);
      break;
    case 0x8f6f34:
      Expression::Reader::getMember(&local_178,this);
      Expression::Member::Reader::getName(&local_148,&local_178);
      join_0x00000010_0x00000000_ = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_148);
      break;
    default:
      goto switchD_008f6e68_caseD_8f6f8c;
    }
  }
  else {
switchD_008f6e68_caseD_8f6f8c:
    kj::StringPtr::StringPtr((StringPtr *)&targetName.content.size_,(void *)0x0);
  }
  return (StringPtr)stack0xffffffffffffffe8;
}

Assistant:

static kj::StringPtr getExpressionTargetName(Expression::Reader exp) {
  kj::StringPtr targetName;
  switch (exp.which()) {
    case Expression::ABSOLUTE_NAME:
      return exp.getAbsoluteName().getValue();
    case Expression::RELATIVE_NAME:
      return exp.getRelativeName().getValue();
    case Expression::APPLICATION:
      return getExpressionTargetName(exp.getApplication().getFunction());
    case Expression::MEMBER:
      return exp.getMember().getName().getValue();
    default:
      return nullptr;
  }
}